

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xmlparse.c
# Opt level: O1

XML_Error processInternalEntity(XML_Parser parser,ENTITY *entity,XML_Bool betweenDecl)

{
  int startTagLevel;
  int iVar1;
  char *s;
  XML_Error XVar2;
  OPEN_INTERNAL_ENTITY *pOVar3;
  char *next;
  char *local_30;
  
  pOVar3 = parser->m_freeInternalEntities;
  if (pOVar3 == (OPEN_INTERNAL_ENTITY *)0x0) {
    pOVar3 = (OPEN_INTERNAL_ENTITY *)(*(parser->m_mem).malloc_fcn)(0x28);
    if (pOVar3 == (OPEN_INTERNAL_ENTITY *)0x0) {
      return XML_ERROR_NO_MEMORY;
    }
  }
  else {
    parser->m_freeInternalEntities = pOVar3->next;
  }
  entity->open = '\x01';
  entity->processed = 0;
  pOVar3->next = parser->m_openInternalEntities;
  parser->m_openInternalEntities = pOVar3;
  pOVar3->entity = entity;
  startTagLevel = parser->m_tagLevel;
  pOVar3->startTagLevel = startTagLevel;
  pOVar3->betweenDecl = '\0';
  pOVar3->internalEventPtr = (char *)0x0;
  pOVar3->internalEventEndPtr = (char *)0x0;
  s = entity->textPtr;
  iVar1 = entity->textLen;
  local_30 = s;
  XVar2 = doContent(parser,startTagLevel,parser->m_internalEncoding,s,s + iVar1,&local_30,'\0');
  if (XVar2 == XML_ERROR_NONE) {
    if ((s + iVar1 == local_30) || ((parser->m_parsingStatus).parsing != XML_SUSPENDED)) {
      entity->open = '\0';
      parser->m_openInternalEntities = pOVar3->next;
      pOVar3->next = parser->m_freeInternalEntities;
      parser->m_freeInternalEntities = pOVar3;
    }
    else {
      entity->processed = (int)local_30 - (int)s;
      parser->m_processor = internalEntityProcessor;
    }
  }
  return XVar2;
}

Assistant:

static enum XML_Error
processInternalEntity(XML_Parser parser, ENTITY *entity,
                      XML_Bool betweenDecl)
{
  const char *textStart, *textEnd;
  const char *next;
  enum XML_Error result;
  OPEN_INTERNAL_ENTITY *openEntity;

  if (parser->m_freeInternalEntities) {
    openEntity = parser->m_freeInternalEntities;
    parser->m_freeInternalEntities = openEntity->next;
  }
  else {
    openEntity = (OPEN_INTERNAL_ENTITY *)MALLOC(parser, sizeof(OPEN_INTERNAL_ENTITY));
    if (!openEntity)
      return XML_ERROR_NO_MEMORY;
  }
  entity->open = XML_TRUE;
  entity->processed = 0;
  openEntity->next = parser->m_openInternalEntities;
  parser->m_openInternalEntities = openEntity;
  openEntity->entity = entity;
  openEntity->startTagLevel = parser->m_tagLevel;
  openEntity->betweenDecl = betweenDecl;
  openEntity->internalEventPtr = NULL;
  openEntity->internalEventEndPtr = NULL;
  textStart = (char *)entity->textPtr;
  textEnd = (char *)(entity->textPtr + entity->textLen);
  /* Set a safe default value in case 'next' does not get set */
  next = textStart;

#ifdef XML_DTD
  if (entity->is_param) {
    int tok = XmlPrologTok(parser->m_internalEncoding, textStart, textEnd, &next);
    result = doProlog(parser, parser->m_internalEncoding, textStart, textEnd, tok,
                      next, &next, XML_FALSE);
  }
  else
#endif /* XML_DTD */
    result = doContent(parser, parser->m_tagLevel, parser->m_internalEncoding, textStart,
                       textEnd, &next, XML_FALSE);

  if (result == XML_ERROR_NONE) {
    if (textEnd != next && parser->m_parsingStatus.parsing == XML_SUSPENDED) {
      entity->processed = (int)(next - textStart);
      parser->m_processor = internalEntityProcessor;
    }
    else {
      entity->open = XML_FALSE;
      parser->m_openInternalEntities = openEntity->next;
      /* put openEntity back in list of free instances */
      openEntity->next = parser->m_freeInternalEntities;
      parser->m_freeInternalEntities = openEntity;
    }
  }
  return result;
}